

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Dim DVar2;
  SPIRType *pSVar3;
  CompilerError *this_00;
  char *__rhs;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->image).type.id);
  paVar1 = &res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  res._M_dataplus._M_p = (pointer)paVar1;
  if ((pSVar3->basetype == UInt) || (pSVar3->basetype == Int)) {
    ::std::__cxx11::string::assign((char *)&res);
  }
  if ((type->image).dim == DimSubpassData && type->basetype == Image) {
    ::std::operator+(&local_38,&res,"subpassInput");
    __rhs = "";
    if ((type->image).ms != false) {
      __rhs = "MS";
    }
    ::std::operator+(__return_storage_ptr__,&local_38,__rhs);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    ::std::__cxx11::string::append((char *)&res);
    DVar2 = (type->image).dim;
    if ((DimSubpassData < DVar2) || ((0x6fU >> (DVar2 & 0x1f) & 1) == 0)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)&res);
    if ((type->image).ms == true) {
      ::std::__cxx11::string::append((char *)&res);
    }
    if ((type->image).arrayed == true) {
      ::std::__cxx11::string::append((char *)&res);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = res.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = res._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = res._M_string_length;
    res._M_string_length = 0;
    res.field_2._M_local_buf[0] = '\0';
    res._M_dataplus._M_p = (pointer)paVar1;
  }
  ::std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t /*id*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";

	return res;
}